

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O1

void __thiscall
TxIndex::TxIndex(TxIndex *this,
                unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> chain,
                size_t n_cache_size,bool f_memory,bool f_wipe)

{
  long lVar1;
  string name;
  DB *this_00;
  pointer *__ptr;
  long in_FS_OFFSET;
  long *plVar2;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffffb8;
  long in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)chain._M_t.
                     super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                     .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  *(undefined8 *)
   chain._M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t
   .super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
   super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl = 0;
  puVar3 = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffffb0,"txindex","");
  name._M_string_length = (size_type)puVar3;
  name._M_dataplus._M_p = (pointer)plVar2;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffffb8;
  name.field_2._8_8_ = in_stack_ffffffffffffffc0;
  BaseIndex::BaseIndex
            (&this->super_BaseIndex,
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)
             &stack0xffffffffffffffa8,name);
  if (puVar3 != &stack0xffffffffffffffc0) {
    operator_delete(puVar3,in_stack_ffffffffffffffc0 + 1);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  (this->super_BaseIndex).super_CValidationInterface._vptr_CValidationInterface =
       (_func_int **)&PTR_UpdatedBlockTip_013dba50;
  this_00 = (DB *)operator_new(0x70);
  DB::DB(this_00,n_cache_size,f_memory,f_wipe);
  (this->m_db)._M_t.super___uniq_ptr_impl<TxIndex::DB,_std::default_delete<TxIndex::DB>_>._M_t.
  super__Tuple_impl<0UL,_TxIndex::DB_*,_std::default_delete<TxIndex::DB>_>.
  super__Head_base<0UL,_TxIndex::DB_*,_false>._M_head_impl = this_00;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TxIndex::TxIndex(std::unique_ptr<interfaces::Chain> chain, size_t n_cache_size, bool f_memory, bool f_wipe)
    : BaseIndex(std::move(chain), "txindex"), m_db(std::make_unique<TxIndex::DB>(n_cache_size, f_memory, f_wipe))
{}